

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

string * __thiscall
perfetto::ipc::BufferedFrameDeserializer::Serialize_abi_cxx11_
          (string *__return_storage_ptr__,BufferedFrameDeserializer *this,Frame *frame)

{
  size_type sVar1;
  uint *puVar2;
  uint *puVar3;
  void *__dest;
  uchar *__src;
  uint local_34;
  undefined1 local_30 [4];
  uint32_t payload_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> payload;
  Frame *frame_local;
  string *buf;
  
  payload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  (**(code **)((this->buf_).p_ + 0x18))();
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  local_34 = (uint)sVar1;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  ::std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  puVar2 = (uint *)::std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  puVar3 = perfetto::base::AssumeLittleEndian<unsigned_int_const*>(&local_34);
  *puVar2 = *puVar3;
  __dest = (void *)::std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  memcpy(__dest,__src,sVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string BufferedFrameDeserializer::Serialize(const Frame& frame) {
  std::vector<uint8_t> payload = frame.SerializeAsArray();
  const uint32_t payload_size = static_cast<uint32_t>(payload.size());
  std::string buf;
  buf.resize(kHeaderSize + payload_size);
  memcpy(&buf[0], base::AssumeLittleEndian(&payload_size), kHeaderSize);
  memcpy(&buf[kHeaderSize], payload.data(), payload.size());
  return buf;
}